

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_send_and_recv(connectdata *conn,void **msg)

{
  size_t *psVar1;
  timeval *ptVar2;
  size_t sVar3;
  char *pcVar4;
  unsigned_short uVar5;
  CURLcode CVar6;
  size_t in_RAX;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  int nread;
  undefined8 local_28;
  
  sVar11 = (conn->proto).ftpc.pp.sendsize;
  local_28 = in_RAX;
  if (sVar11 == 0) {
    uVar7 = (conn->proto).smbc.upload_size;
    if (uVar7 == 0) goto LAB_00143f54;
    uVar8 = 0x4000;
    if (uVar7 < 0x4000) {
      uVar8 = uVar7;
    }
    local_28 = CONCAT44((int)(in_RAX >> 0x20),(int)uVar8);
    (conn->data->req).upload_fromhere = (conn->data->state).uploadbuffer;
    CVar6 = Curl_fillreadbuffer(conn,(int)uVar8,(int *)&local_28);
    if ((CVar6 != CURLE_AGAIN) && (CVar6 != CURLE_OK)) {
      return CVar6;
    }
    sVar11 = (size_t)(int)local_28;
    if (sVar11 == 0) {
      return CURLE_OK;
    }
    psVar1 = &(conn->proto).ftpc.pp.sendleft;
    *psVar1 = *psVar1 - sVar11;
    (conn->proto).smbc.send_size = sVar11;
    (conn->proto).ftpc.pp.response.tv_sec = 0;
  }
  sVar3 = (conn->proto).smbc.sent;
  sVar11 = sVar11 - sVar3;
  CVar6 = Curl_write(conn,0,(conn->data->state).uploadbuffer + sVar3,sVar11,&local_28);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  if (local_28 == sVar11) {
    (conn->proto).ftpc.pp.sendsize = 0;
  }
  else {
    ptVar2 = &(conn->proto).ftpc.pp.response;
    ptVar2->tv_sec = ptVar2->tv_sec + local_28;
    if ((conn->proto).ftpc.pp.sendsize != 0) {
      return CURLE_AGAIN;
    }
  }
LAB_00143f54:
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    return CURLE_AGAIN;
  }
  pcVar4 = (conn->proto).ftpc.pp.sendthis;
  sVar11 = (conn->proto).smbc.got;
  CVar6 = Curl_read(conn,0,pcVar4 + sVar11,0x9000 - sVar11,&local_28);
  if (CVar6 == CURLE_OK) {
    if ((local_28 != 0) &&
       (uVar7 = local_28 + (conn->proto).ftpc.pp.response.tv_usec,
       (conn->proto).ftpc.pp.response.tv_usec = uVar7, 3 < uVar7)) {
      uVar5 = Curl_read16_be((uchar *)(pcVar4 + 2));
      if ((ulong)uVar5 + 4 <= (ulong)(conn->proto).ftpc.pp.response.tv_usec) {
        if (0x20 < uVar5) {
          uVar10 = (uint)(byte)pcVar4[0x24] * 2 + 0x27;
          uVar9 = (uint)((ulong)uVar5 + 4);
          if ((uVar10 <= uVar9) &&
             (uVar5 = Curl_read16_le((uchar *)(pcVar4 + (ulong)((uint)(byte)pcVar4[0x24] * 2) + 0x25
                                              )), uVar9 < uVar10 + uVar5)) {
            return CURLE_READ_ERROR;
          }
        }
        *msg = pcVar4;
      }
    }
    return CURLE_OK;
  }
  return CVar6;
}

Assistant:

static CURLcode smb_send_and_recv(struct connectdata *conn, void **msg)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    int nread = smbc->upload_size > BUFSIZE ? BUFSIZE :
                                              (int) smbc->upload_size;
    conn->data->req.upload_fromhere = conn->data->state.uploadbuffer;
    result = Curl_fillreadbuffer(conn, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(conn);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(conn, msg);
}